

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O3

size_t Assimp::FBX::ParseTokenAsDim(Token *t,char **err_out)

{
  uint64_t uVar1;
  char *pcVar2;
  uint length;
  char *out;
  uint local_24;
  char *local_20;
  
  *err_out = (char *)0x0;
  if (t->type == TokenType_DATA) {
    pcVar2 = t->sbegin;
    if (t->column == 0xffffffff) {
      if (*pcVar2 == 'L') {
        return *(size_t *)(pcVar2 + 1);
      }
      pcVar2 = "failed to parse ID, unexpected data type, expected L(ong) (binary)";
    }
    else if (*pcVar2 == '*') {
      local_24 = *(int *)&t->send - (int)pcVar2;
      if (local_24 == 0) {
        pcVar2 = "expected valid integer number after asterisk";
      }
      else {
        local_20 = (char *)0x0;
        uVar1 = strtoul10_64(pcVar2 + 1,&local_20,&local_24);
        if (local_20 <= t->send) {
          return uVar1;
        }
        pcVar2 = "failed to parse ID";
      }
    }
    else {
      pcVar2 = "expected asterisk before array dimension";
    }
  }
  else {
    pcVar2 = "expected TOK_DATA token";
  }
  *err_out = pcVar2;
  return 0;
}

Assistant:

size_t ParseTokenAsDim(const Token& t, const char*& err_out)
{
    // same as ID parsing, except there is a trailing asterisk
    err_out = NULL;

    if (t.Type() != TokenType_DATA) {
        err_out = "expected TOK_DATA token";
        return 0;
    }

    if(t.IsBinary())
    {
        const char* data = t.begin();
        if (data[0] != 'L') {
            err_out = "failed to parse ID, unexpected data type, expected L(ong) (binary)";
            return 0;
        }

        BE_NCONST uint64_t id = SafeParse<uint64_t>(data+1, t.end());
        AI_SWAP8(id);
        return static_cast<size_t>(id);
    }

    if(*t.begin() != '*') {
        err_out = "expected asterisk before array dimension";
        return 0;
    }

    // XXX: should use size_t here
    unsigned int length = static_cast<unsigned int>(t.end() - t.begin());
    if(length == 0) {
        err_out = "expected valid integer number after asterisk";
        return 0;
    }

    const char* out = nullptr;
    const size_t id = static_cast<size_t>(strtoul10_64(t.begin() + 1,&out,&length));
    if (out > t.end()) {
        err_out = "failed to parse ID";
        return 0;
    }

    return id;
}